

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::convertFlaggedUnits<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result,double basis)

{
  bool bVar1;
  bool bVar2;
  unit_data base;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double basis_local;
  precise_unit *result_local;
  precise_unit *start_local;
  double val_local;
  
  bVar1 = is_temperature(start);
  if ((bVar1) || (bVar1 = is_temperature(result), bVar1)) {
    dVar4 = convertTemperature<units::precise_unit,units::precise_unit>(val,start,result);
    return dVar4;
  }
  base = precise_unit::base_units((precise_unit *)precise::pressure::psi);
  bVar1 = precise_unit::has_same_base(start,base);
  if (!bVar1) {
    return NAN;
  }
  bVar1 = precise_unit::has_e_flag(start);
  bVar2 = precise_unit::has_e_flag(result);
  if (bVar1 == bVar2) {
    dVar4 = precise_unit::multiplier(start);
    dVar5 = precise_unit::multiplier(result);
    return (val * dVar4) / dVar5;
  }
  bVar1 = precise_unit::has_e_flag(start);
  if (bVar1) {
    uVar3 = std::isnan(basis);
    if ((uVar3 & 1) == 0) {
      dVar4 = precise_unit::multiplier(start);
      dVar5 = precise_unit::multiplier(result);
      return ((val + basis) * dVar4) / dVar5;
    }
    dVar4 = precise_unit::multiplier(start);
    dVar5 = precise_unit::multiplier((precise_unit *)precise::pressure::atm);
    dVar6 = precise_unit::multiplier(result);
    return (val * dVar4 + dVar5) / dVar6;
  }
  uVar3 = std::isnan(basis);
  if ((uVar3 & 1) == 0) {
    dVar4 = precise_unit::multiplier(start);
    dVar5 = precise_unit::multiplier(result);
    return (val * dVar4) / dVar5 - basis;
  }
  dVar4 = precise_unit::multiplier(start);
  dVar5 = precise_unit::multiplier((precise_unit *)precise::pressure::atm);
  dVar6 = precise_unit::multiplier(result);
  return (val * dVar4 + -dVar5) / dVar6;
}

Assistant:

double convertFlaggedUnits(
        double val,
        const UX& start,
        const UX2& result,
        double basis = constants::invalid_conversion)
    {
        if (is_temperature(start) || is_temperature(result)) {
            return convertTemperature(val, start, result);
        }
        if (start.has_same_base(precise::pressure::psi.base_units())) {
            if (start.has_e_flag() == result.has_e_flag()) {
                return val * start.multiplier() / result.multiplier();
            }
            if (start.has_e_flag()) {
                if (std::isnan(basis)) {
                    return (val * start.multiplier() +
                            precise::pressure::atm.multiplier()) /
                        result.multiplier();
                }
                return (val + basis) * start.multiplier() / result.multiplier();
            }
            if (std::isnan(basis)) {
                return (val * start.multiplier() -
                        precise::pressure::atm.multiplier()) /
                    result.multiplier();
            }
            return (val * start.multiplier() / result.multiplier()) - basis;
        }
        return constants::invalid_conversion;
    }